

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O1

void __thiscall
TEST_UtestShellPointerArrayTest_reverse_TestShell::
~TEST_UtestShellPointerArrayTest_reverse_TestShell
          (TEST_UtestShellPointerArrayTest_reverse_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(UtestShellPointerArrayTest, reverse)
{
    UT_PTR_SET(PlatformSpecificRand, getOne);

    UtestShellPointerArray tests(test0);
    tests.reverse();
    CHECK(tests.get(0) == test2);
    CHECK(tests.get(1) == test1);
    CHECK(tests.get(2) == test0);
}